

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChQuadrature.h
# Opt level: O3

void chrono::ChQuadrature::Integrate3D<Eigen::Matrix<double,54,1,0,54,1>>
               (Matrix<double,_54,_1,_0,_54,_1> *result,
               ChIntegrable3D<Eigen::Matrix<double,_54,_1,_0,_54,_1>_> *integrand,double Xa,
               double Xb,double Ya,double Yb,double Za,double Zb,int order)

{
  long lVar1;
  double dVar2;
  ChQuadratureTables *pCVar3;
  pointer pdVar4;
  undefined8 uVar5;
  pointer pdVar6;
  ulong uVar7;
  pointer pdVar8;
  ActualDstType actualDst;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  uint uVar13;
  ulong uVar14;
  pointer pvVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [64];
  undefined1 auVar44 [64];
  undefined1 auVar45 [64];
  undefined1 auVar46 [64];
  undefined1 auVar47 [64];
  undefined1 auVar48 [64];
  undefined1 auVar49 [64];
  undefined1 auVar50 [64];
  undefined1 auVar51 [64];
  undefined1 auVar52 [64];
  undefined1 auVar53 [64];
  undefined1 auVar54 [64];
  undefined1 auVar55 [64];
  undefined1 auVar56 [64];
  undefined1 auVar57 [64];
  undefined1 auVar58 [64];
  undefined1 auVar59 [64];
  undefined1 auVar60 [64];
  undefined1 auVar61 [64];
  undefined1 auVar62 [64];
  undefined1 auVar63 [64];
  undefined1 auVar64 [64];
  undefined1 auVar65 [64];
  undefined1 in_ZMM23 [64];
  undefined1 auVar66 [64];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  Matrix<double,_54,_1,_0,_54,_1> val;
  ChQuadratureTables *local_240;
  pointer local_238;
  double local_1e8;
  double dStack_1e0;
  double local_1d8;
  double dStack_1d0;
  double local_1c8;
  double dStack_1c0;
  double local_1b8;
  double dStack_1b0;
  double local_1a8;
  double dStack_1a0;
  double local_198;
  double dStack_190;
  double local_188;
  double dStack_180;
  double local_178;
  double dStack_170;
  double local_168;
  double dStack_160;
  double local_158;
  double dStack_150;
  double local_148;
  double dStack_140;
  double local_138;
  double dStack_130;
  double local_128;
  double dStack_120;
  double local_118;
  double dStack_110;
  double local_108;
  double dStack_100;
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  auVar16 = in_ZMM23._0_16_;
  pCVar3 = GetStaticTables();
  uVar11 = ((long)(pCVar3->Lroots).
                  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(pCVar3->Lroots).
                  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
  if (uVar11 < (uint)order) {
    local_240 = (ChQuadratureTables *)::operator_new(0x30);
    ChQuadratureTables::ChQuadratureTables(local_240,order,order);
    ChQuadratureTables::PrintTables(local_240);
    local_238 = (local_240->Weight).
                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
    pvVar15 = (local_240->Lroots).
              super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  }
  else {
    local_240 = GetStaticTables();
    pvVar15 = (local_240->Lroots).
              super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start + (long)order + -1;
    local_238 = (local_240->Weight).
                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start + (long)order + -1;
  }
  auVar16 = vxorpd_avx512vl(auVar16,auVar16);
  auVar69._8_8_ = 0;
  auVar69._0_8_ = Xb;
  auVar74._8_8_ = 0;
  auVar74._0_8_ = Xa;
  auVar17 = vsubsd_avx512f(auVar69,auVar74);
  auVar17 = vmulsd_avx512f(auVar17,ZEXT816(0x3fe0000000000000));
  auVar72._8_8_ = 0;
  auVar72._0_8_ = Yb;
  auVar73._8_8_ = 0;
  auVar73._0_8_ = Ya;
  auVar18 = vsubsd_avx512f(auVar72,auVar73);
  auVar18 = vmulsd_avx512f(auVar18,ZEXT816(0x3fe0000000000000));
  auVar70._8_8_ = 0;
  auVar70._0_8_ = Zb;
  auVar71._8_8_ = 0;
  auVar71._0_8_ = Za;
  auVar19 = vsubsd_avx512f(auVar70,auVar71);
  auVar67 = ZEXT816(0x3fe0000000000000);
  auVar19 = vmulsd_avx512f(auVar19,auVar67);
  auVar20 = vmulpd_avx512vl(auVar16,*(undefined1 (*) [16])
                                     (result->
                                     super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>)
                                     .m_storage.m_data.array);
  *(undefined1 (*) [16])
   (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.array =
       auVar20;
  auVar20 = vmulpd_avx512vl(auVar16,*(undefined1 (*) [16])
                                     ((result->
                                      super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>
                                      ).m_storage.m_data.array + 2));
  *(undefined1 (*) [16])
   ((result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.array
   + 2) = auVar20;
  auVar20 = vmulpd_avx512vl(auVar16,*(undefined1 (*) [16])
                                     ((result->
                                      super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>
                                      ).m_storage.m_data.array + 4));
  *(undefined1 (*) [16])
   ((result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.array
   + 4) = auVar20;
  auVar20 = vmulpd_avx512vl(auVar16,*(undefined1 (*) [16])
                                     ((result->
                                      super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>
                                      ).m_storage.m_data.array + 6));
  auVar43 = ZEXT1664(auVar20);
  *(undefined1 (*) [16])
   ((result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.array
   + 6) = auVar20;
  auVar21 = vmulpd_avx512vl(auVar16,*(undefined1 (*) [16])
                                     ((result->
                                      super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>
                                      ).m_storage.m_data.array + 8));
  auVar44 = ZEXT1664(auVar21);
  *(undefined1 (*) [16])
   ((result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.array
   + 8) = auVar21;
  auVar22 = vmulpd_avx512vl(auVar16,*(undefined1 (*) [16])
                                     ((result->
                                      super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>
                                      ).m_storage.m_data.array + 10));
  auVar45 = ZEXT1664(auVar22);
  *(undefined1 (*) [16])
   ((result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.array
   + 10) = auVar22;
  auVar23 = vmulpd_avx512vl(auVar16,*(undefined1 (*) [16])
                                     ((result->
                                      super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>
                                      ).m_storage.m_data.array + 0xc));
  auVar46 = ZEXT1664(auVar23);
  *(undefined1 (*) [16])
   ((result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.array
   + 0xc) = auVar23;
  auVar24 = vmulpd_avx512vl(auVar16,*(undefined1 (*) [16])
                                     ((result->
                                      super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>
                                      ).m_storage.m_data.array + 0xe));
  auVar47 = ZEXT1664(auVar24);
  *(undefined1 (*) [16])
   ((result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.array
   + 0xe) = auVar24;
  auVar25 = vmulpd_avx512vl(auVar16,*(undefined1 (*) [16])
                                     ((result->
                                      super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>
                                      ).m_storage.m_data.array + 0x10));
  auVar48 = ZEXT1664(auVar25);
  *(undefined1 (*) [16])
   ((result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.array
   + 0x10) = auVar25;
  auVar26 = vmulpd_avx512vl(auVar16,*(undefined1 (*) [16])
                                     ((result->
                                      super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>
                                      ).m_storage.m_data.array + 0x12));
  auVar49 = ZEXT1664(auVar26);
  *(undefined1 (*) [16])
   ((result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.array
   + 0x12) = auVar26;
  auVar27 = vmulpd_avx512vl(auVar16,*(undefined1 (*) [16])
                                     ((result->
                                      super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>
                                      ).m_storage.m_data.array + 0x14));
  auVar50 = ZEXT1664(auVar27);
  *(undefined1 (*) [16])
   ((result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.array
   + 0x14) = auVar27;
  auVar28 = vmulpd_avx512vl(auVar16,*(undefined1 (*) [16])
                                     ((result->
                                      super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>
                                      ).m_storage.m_data.array + 0x16));
  auVar51 = ZEXT1664(auVar28);
  *(undefined1 (*) [16])
   ((result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.array
   + 0x16) = auVar28;
  auVar29 = vmulpd_avx512vl(auVar16,*(undefined1 (*) [16])
                                     ((result->
                                      super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>
                                      ).m_storage.m_data.array + 0x18));
  auVar52 = ZEXT1664(auVar29);
  *(undefined1 (*) [16])
   ((result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.array
   + 0x18) = auVar29;
  auVar30 = vmulpd_avx512vl(auVar16,*(undefined1 (*) [16])
                                     ((result->
                                      super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>
                                      ).m_storage.m_data.array + 0x1a));
  auVar53 = ZEXT1664(auVar30);
  *(undefined1 (*) [16])
   ((result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.array
   + 0x1a) = auVar30;
  auVar31 = vmulpd_avx512vl(auVar16,*(undefined1 (*) [16])
                                     ((result->
                                      super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>
                                      ).m_storage.m_data.array + 0x1c));
  auVar54 = ZEXT1664(auVar31);
  *(undefined1 (*) [16])
   ((result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.array
   + 0x1c) = auVar31;
  auVar32 = vmulpd_avx512vl(auVar16,*(undefined1 (*) [16])
                                     ((result->
                                      super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>
                                      ).m_storage.m_data.array + 0x1e));
  auVar55 = ZEXT1664(auVar32);
  *(undefined1 (*) [16])
   ((result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.array
   + 0x1e) = auVar32;
  auVar33 = vmulpd_avx512vl(auVar16,*(undefined1 (*) [16])
                                     ((result->
                                      super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>
                                      ).m_storage.m_data.array + 0x20));
  auVar56 = ZEXT1664(auVar33);
  *(undefined1 (*) [16])
   ((result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.array
   + 0x20) = auVar33;
  auVar34 = vmulpd_avx512vl(auVar16,*(undefined1 (*) [16])
                                     ((result->
                                      super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>
                                      ).m_storage.m_data.array + 0x22));
  auVar57 = ZEXT1664(auVar34);
  *(undefined1 (*) [16])
   ((result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.array
   + 0x22) = auVar34;
  auVar35 = vmulpd_avx512vl(auVar16,*(undefined1 (*) [16])
                                     ((result->
                                      super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>
                                      ).m_storage.m_data.array + 0x24));
  auVar58 = ZEXT1664(auVar35);
  *(undefined1 (*) [16])
   ((result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.array
   + 0x24) = auVar35;
  auVar36 = vmulpd_avx512vl(auVar16,*(undefined1 (*) [16])
                                     ((result->
                                      super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>
                                      ).m_storage.m_data.array + 0x26));
  auVar59 = ZEXT1664(auVar36);
  *(undefined1 (*) [16])
   ((result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.array
   + 0x26) = auVar36;
  auVar37 = vmulpd_avx512vl(auVar16,*(undefined1 (*) [16])
                                     ((result->
                                      super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>
                                      ).m_storage.m_data.array + 0x28));
  auVar60 = ZEXT1664(auVar37);
  *(undefined1 (*) [16])
   ((result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.array
   + 0x28) = auVar37;
  auVar38 = vmulpd_avx512vl(auVar16,*(undefined1 (*) [16])
                                     ((result->
                                      super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>
                                      ).m_storage.m_data.array + 0x2a));
  auVar61 = ZEXT1664(auVar38);
  *(undefined1 (*) [16])
   ((result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.array
   + 0x2a) = auVar38;
  auVar39 = vmulpd_avx512vl(auVar16,*(undefined1 (*) [16])
                                     ((result->
                                      super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>
                                      ).m_storage.m_data.array + 0x2c));
  auVar62 = ZEXT1664(auVar39);
  *(undefined1 (*) [16])
   ((result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.array
   + 0x2c) = auVar39;
  auVar40 = vmulpd_avx512vl(auVar16,*(undefined1 (*) [16])
                                     ((result->
                                      super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>
                                      ).m_storage.m_data.array + 0x2e));
  auVar63 = ZEXT1664(auVar40);
  *(undefined1 (*) [16])
   ((result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.array
   + 0x2e) = auVar40;
  auVar41 = vmulpd_avx512vl(auVar16,*(undefined1 (*) [16])
                                     ((result->
                                      super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>
                                      ).m_storage.m_data.array + 0x30));
  auVar64 = ZEXT1664(auVar41);
  *(undefined1 (*) [16])
   ((result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.array
   + 0x30) = auVar41;
  auVar42 = vmulpd_avx512vl(auVar16,*(undefined1 (*) [16])
                                     ((result->
                                      super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>
                                      ).m_storage.m_data.array + 0x32));
  auVar65 = ZEXT1664(auVar42);
  *(undefined1 (*) [16])
   ((result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.array
   + 0x32) = auVar42;
  auVar16 = vmulpd_avx512vl(auVar16,*(undefined1 (*) [16])
                                     ((result->
                                      super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>
                                      ).m_storage.m_data.array + 0x34));
  auVar66 = ZEXT1664(auVar16);
  *(undefined1 (*) [16])
   ((result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.array
   + 0x34) = auVar16;
  pdVar4 = (pvVar15->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pdVar6 = (pvVar15->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (pdVar6 != pdVar4) {
    auVar16 = vaddsd_avx512f(auVar74,auVar69);
    auVar20 = vaddsd_avx512f(auVar71,auVar70);
    uVar12 = 0;
    auVar16 = vmulsd_avx512f(auVar16,auVar67);
    vmovsd_avx512f(auVar16);
    auVar16 = vaddsd_avx512f(auVar73,auVar72);
    auVar16 = vmulsd_avx512f(auVar16,auVar67);
    auVar20 = vmulsd_avx512f(auVar20,auVar67);
    vmovsd_avx512f(auVar16);
    vmovsd_avx512f(auVar20);
    do {
      pdVar8 = pdVar4;
      if (pdVar6 != pdVar4) {
        uVar9 = 0;
        pdVar8 = pdVar6;
        do {
          uVar13 = 1;
          uVar14 = 0;
          uVar7 = (long)pdVar8 - (long)pdVar4 >> 3;
          do {
            uVar10 = uVar12;
            if ((uVar7 <= uVar12) || (uVar10 = uVar9, uVar7 <= uVar9)) {
LAB_007385fd:
              uVar5 = std::__throw_out_of_range_fmt
                                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                                 ,uVar10);
              operator_delete(pvVar15,0x30);
              _Unwind_Resume(uVar5);
            }
            auVar22._8_8_ = 0;
            auVar22._0_8_ = pdVar4[uVar12];
            auVar23._8_8_ = 0;
            auVar23._0_8_ = Xb;
            auVar25._8_8_ = 0;
            auVar25._0_8_ = Yb;
            auVar27._8_8_ = 0;
            auVar27._0_8_ = Zb;
            auVar16._8_8_ = 0;
            auVar16._0_8_ = auVar17._0_8_;
            auVar16 = vfmadd132sd_fma(auVar22,auVar23,auVar16);
            auVar24._8_8_ = 0;
            auVar24._0_8_ = pdVar4[uVar9];
            auVar20._8_8_ = 0;
            auVar20._0_8_ = auVar18._0_8_;
            auVar20 = vfmadd132sd_fma(auVar24,auVar25,auVar20);
            auVar26._8_8_ = 0;
            auVar26._0_8_ = pdVar4[uVar14];
            auVar21._8_8_ = 0;
            auVar21._0_8_ = auVar19._0_8_;
            auVar21 = vfmadd132sd_fma(auVar26,auVar27,auVar21);
            (*integrand->_vptr_ChIntegrable3D[2])
                      (auVar16._0_8_,auVar20._0_8_,auVar21._0_8_,integrand,&local_1e8);
            lVar1 = *(long *)&(local_238->super__Vector_base<double,_std::allocator<double>_>).
                              _M_impl;
            uVar7 = (long)(local_238->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                          super__Vector_impl_data._M_finish - lVar1 >> 3;
            uVar10 = uVar12;
            if ((uVar7 <= uVar12) ||
               ((uVar10 = uVar9, uVar7 <= uVar9 || (uVar10 = uVar14, uVar7 <= uVar14))))
            goto LAB_007385fd;
            dVar2 = *(double *)(lVar1 + uVar12 * 8) * *(double *)(lVar1 + uVar9 * 8) *
                    *(double *)(lVar1 + uVar14 * 8);
            uVar14 = (ulong)uVar13;
            uVar13 = uVar13 + 1;
            auVar28._8_8_ = dVar2;
            auVar28._0_8_ = dVar2;
            local_1e8 = dVar2 * local_1e8;
            dStack_1e0 = dVar2 * dStack_1e0;
            local_1d8 = dVar2 * local_1d8;
            dStack_1d0 = dVar2 * dStack_1d0;
            local_1c8 = dVar2 * local_1c8;
            dStack_1c0 = dVar2 * dStack_1c0;
            local_1b8 = dVar2 * local_1b8;
            dStack_1b0 = dVar2 * dStack_1b0;
            local_1a8 = dVar2 * local_1a8;
            dStack_1a0 = dVar2 * dStack_1a0;
            local_198 = dVar2 * local_198;
            dStack_190 = dVar2 * dStack_190;
            local_188 = dVar2 * local_188;
            dStack_180 = dVar2 * dStack_180;
            local_178 = dVar2 * local_178;
            dStack_170 = dVar2 * dStack_170;
            local_168 = dVar2 * local_168;
            dStack_160 = dVar2 * dStack_160;
            local_158 = dVar2 * local_158;
            dStack_150 = dVar2 * dStack_150;
            local_148 = dVar2 * local_148;
            dStack_140 = dVar2 * dStack_140;
            local_138 = dVar2 * local_138;
            dStack_130 = dVar2 * dStack_130;
            local_128 = dVar2 * local_128;
            dStack_120 = dVar2 * dStack_120;
            local_118 = dVar2 * local_118;
            dStack_110 = dVar2 * dStack_110;
            local_108 = dVar2 * local_108;
            dStack_100 = dVar2 * dStack_100;
            local_f8 = vmulpd_avx512vl(auVar28,local_f8);
            local_e8 = vmulpd_avx512vl(auVar28,local_e8);
            local_d8 = vmulpd_avx512vl(auVar28,local_d8);
            local_c8 = vmulpd_avx512vl(auVar28,local_c8);
            local_b8 = vmulpd_avx512vl(auVar28,local_b8);
            local_a8 = vmulpd_avx512vl(auVar28,local_a8);
            local_98 = vmulpd_avx512vl(auVar28,local_98);
            local_88 = vmulpd_avx512vl(auVar28,local_88);
            local_78 = vmulpd_avx512vl(auVar28,local_78);
            local_68 = vmulpd_avx512vl(auVar28,local_68);
            local_58 = vmulpd_avx512vl(auVar28,local_58);
            local_48 = vmulpd_avx512vl(auVar28,local_48);
            dVar2 = (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).
                    m_storage.m_data.array[1];
            (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.
            m_data.array[0] =
                 local_1e8 +
                 (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.
                 m_data.array[0];
            (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.
            m_data.array[1] = dStack_1e0 + dVar2;
            dVar2 = (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).
                    m_storage.m_data.array[3];
            (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.
            m_data.array[2] =
                 local_1d8 +
                 (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.
                 m_data.array[2];
            (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.
            m_data.array[3] = dStack_1d0 + dVar2;
            dVar2 = (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).
                    m_storage.m_data.array[5];
            (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.
            m_data.array[4] =
                 local_1c8 +
                 (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.
                 m_data.array[4];
            (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.
            m_data.array[5] = dStack_1c0 + dVar2;
            auVar29._0_8_ =
                 local_1b8 +
                 (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.
                 m_data.array[6];
            auVar29._8_8_ =
                 dStack_1b0 +
                 (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.
                 m_data.array[7];
            auVar43 = ZEXT1664(auVar29);
            *(undefined1 (*) [16])
             ((result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.
              m_data.array + 6) = auVar29;
            auVar30._0_8_ =
                 local_1a8 +
                 (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.
                 m_data.array[8];
            auVar30._8_8_ =
                 dStack_1a0 +
                 (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.
                 m_data.array[9];
            auVar44 = ZEXT1664(auVar30);
            *(undefined1 (*) [16])
             ((result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.
              m_data.array + 8) = auVar30;
            auVar31._0_8_ =
                 local_198 +
                 (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.
                 m_data.array[10];
            auVar31._8_8_ =
                 dStack_190 +
                 (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.
                 m_data.array[0xb];
            auVar45 = ZEXT1664(auVar31);
            *(undefined1 (*) [16])
             ((result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.
              m_data.array + 10) = auVar31;
            auVar32._0_8_ =
                 local_188 +
                 (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.
                 m_data.array[0xc];
            auVar32._8_8_ =
                 dStack_180 +
                 (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.
                 m_data.array[0xd];
            auVar46 = ZEXT1664(auVar32);
            *(undefined1 (*) [16])
             ((result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.
              m_data.array + 0xc) = auVar32;
            auVar33._0_8_ =
                 local_178 +
                 (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.
                 m_data.array[0xe];
            auVar33._8_8_ =
                 dStack_170 +
                 (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.
                 m_data.array[0xf];
            auVar47 = ZEXT1664(auVar33);
            *(undefined1 (*) [16])
             ((result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.
              m_data.array + 0xe) = auVar33;
            auVar34._0_8_ =
                 local_168 +
                 (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.
                 m_data.array[0x10];
            auVar34._8_8_ =
                 dStack_160 +
                 (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.
                 m_data.array[0x11];
            auVar48 = ZEXT1664(auVar34);
            *(undefined1 (*) [16])
             ((result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.
              m_data.array + 0x10) = auVar34;
            auVar35._0_8_ =
                 local_158 +
                 (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.
                 m_data.array[0x12];
            auVar35._8_8_ =
                 dStack_150 +
                 (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.
                 m_data.array[0x13];
            auVar49 = ZEXT1664(auVar35);
            *(undefined1 (*) [16])
             ((result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.
              m_data.array + 0x12) = auVar35;
            auVar36._0_8_ =
                 local_148 +
                 (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.
                 m_data.array[0x14];
            auVar36._8_8_ =
                 dStack_140 +
                 (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.
                 m_data.array[0x15];
            auVar50 = ZEXT1664(auVar36);
            *(undefined1 (*) [16])
             ((result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.
              m_data.array + 0x14) = auVar36;
            auVar37._0_8_ =
                 local_138 +
                 (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.
                 m_data.array[0x16];
            auVar37._8_8_ =
                 dStack_130 +
                 (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.
                 m_data.array[0x17];
            auVar51 = ZEXT1664(auVar37);
            *(undefined1 (*) [16])
             ((result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.
              m_data.array + 0x16) = auVar37;
            auVar38._0_8_ =
                 local_128 +
                 (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.
                 m_data.array[0x18];
            auVar38._8_8_ =
                 dStack_120 +
                 (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.
                 m_data.array[0x19];
            auVar52 = ZEXT1664(auVar38);
            *(undefined1 (*) [16])
             ((result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.
              m_data.array + 0x18) = auVar38;
            auVar39._0_8_ =
                 local_118 +
                 (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.
                 m_data.array[0x1a];
            auVar39._8_8_ =
                 dStack_110 +
                 (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.
                 m_data.array[0x1b];
            auVar53 = ZEXT1664(auVar39);
            *(undefined1 (*) [16])
             ((result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.
              m_data.array + 0x1a) = auVar39;
            auVar40._0_8_ =
                 local_108 +
                 (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.
                 m_data.array[0x1c];
            auVar40._8_8_ =
                 dStack_100 +
                 (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.
                 m_data.array[0x1d];
            auVar54 = ZEXT1664(auVar40);
            *(undefined1 (*) [16])
             ((result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.
              m_data.array + 0x1c) = auVar40;
            auVar16 = vaddpd_avx512vl(local_f8,*(undefined1 (*) [16])
                                                ((result->
                                                 super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>
                                                 ).m_storage.m_data.array + 0x1e));
            auVar55 = ZEXT1664(auVar16);
            *(undefined1 (*) [16])
             ((result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.
              m_data.array + 0x1e) = auVar16;
            auVar16 = vaddpd_avx512vl(local_e8,*(undefined1 (*) [16])
                                                ((result->
                                                 super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>
                                                 ).m_storage.m_data.array + 0x20));
            auVar56 = ZEXT1664(auVar16);
            *(undefined1 (*) [16])
             ((result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.
              m_data.array + 0x20) = auVar16;
            auVar16 = vaddpd_avx512vl(local_d8,*(undefined1 (*) [16])
                                                ((result->
                                                 super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>
                                                 ).m_storage.m_data.array + 0x22));
            auVar57 = ZEXT1664(auVar16);
            *(undefined1 (*) [16])
             ((result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.
              m_data.array + 0x22) = auVar16;
            auVar16 = vaddpd_avx512vl(local_c8,*(undefined1 (*) [16])
                                                ((result->
                                                 super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>
                                                 ).m_storage.m_data.array + 0x24));
            auVar58 = ZEXT1664(auVar16);
            *(undefined1 (*) [16])
             ((result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.
              m_data.array + 0x24) = auVar16;
            auVar16 = vaddpd_avx512vl(local_b8,*(undefined1 (*) [16])
                                                ((result->
                                                 super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>
                                                 ).m_storage.m_data.array + 0x26));
            auVar59 = ZEXT1664(auVar16);
            *(undefined1 (*) [16])
             ((result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.
              m_data.array + 0x26) = auVar16;
            auVar16 = vaddpd_avx512vl(local_a8,*(undefined1 (*) [16])
                                                ((result->
                                                 super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>
                                                 ).m_storage.m_data.array + 0x28));
            auVar60 = ZEXT1664(auVar16);
            *(undefined1 (*) [16])
             ((result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.
              m_data.array + 0x28) = auVar16;
            auVar16 = vaddpd_avx512vl(local_98,*(undefined1 (*) [16])
                                                ((result->
                                                 super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>
                                                 ).m_storage.m_data.array + 0x2a));
            auVar61 = ZEXT1664(auVar16);
            *(undefined1 (*) [16])
             ((result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.
              m_data.array + 0x2a) = auVar16;
            auVar16 = vaddpd_avx512vl(local_88,*(undefined1 (*) [16])
                                                ((result->
                                                 super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>
                                                 ).m_storage.m_data.array + 0x2c));
            auVar62 = ZEXT1664(auVar16);
            *(undefined1 (*) [16])
             ((result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.
              m_data.array + 0x2c) = auVar16;
            auVar16 = vaddpd_avx512vl(local_78,*(undefined1 (*) [16])
                                                ((result->
                                                 super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>
                                                 ).m_storage.m_data.array + 0x2e));
            auVar63 = ZEXT1664(auVar16);
            *(undefined1 (*) [16])
             ((result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.
              m_data.array + 0x2e) = auVar16;
            auVar16 = vaddpd_avx512vl(local_68,*(undefined1 (*) [16])
                                                ((result->
                                                 super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>
                                                 ).m_storage.m_data.array + 0x30));
            auVar64 = ZEXT1664(auVar16);
            *(undefined1 (*) [16])
             ((result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.
              m_data.array + 0x30) = auVar16;
            auVar16 = vaddpd_avx512vl(local_58,*(undefined1 (*) [16])
                                                ((result->
                                                 super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>
                                                 ).m_storage.m_data.array + 0x32));
            auVar65 = ZEXT1664(auVar16);
            *(undefined1 (*) [16])
             ((result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.
              m_data.array + 0x32) = auVar16;
            auVar16 = vaddpd_avx512vl(local_48,*(undefined1 (*) [16])
                                                ((result->
                                                 super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>
                                                 ).m_storage.m_data.array + 0x34));
            auVar66 = ZEXT1664(auVar16);
            *(undefined1 (*) [16])
             ((result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.
              m_data.array + 0x34) = auVar16;
            pdVar8 = (pvVar15->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_finish;
            pdVar4 = (pvVar15->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_start;
            uVar7 = (long)pdVar8 - (long)pdVar4 >> 3;
          } while (uVar14 < uVar7);
          uVar9 = (ulong)((int)uVar9 + 1);
        } while ((uVar9 < uVar7) && (pdVar8 != pdVar4));
      }
      auVar16 = auVar66._0_16_;
      auVar42 = auVar65._0_16_;
      auVar41 = auVar64._0_16_;
      auVar40 = auVar63._0_16_;
      auVar39 = auVar62._0_16_;
      auVar38 = auVar61._0_16_;
      auVar37 = auVar60._0_16_;
      auVar36 = auVar59._0_16_;
      auVar35 = auVar58._0_16_;
      auVar34 = auVar57._0_16_;
      auVar33 = auVar56._0_16_;
      auVar32 = auVar55._0_16_;
      auVar31 = auVar54._0_16_;
      auVar30 = auVar53._0_16_;
      auVar29 = auVar52._0_16_;
      auVar28 = auVar51._0_16_;
      auVar27 = auVar50._0_16_;
      auVar26 = auVar49._0_16_;
      auVar25 = auVar48._0_16_;
      auVar24 = auVar47._0_16_;
      auVar22 = auVar45._0_16_;
      auVar23 = auVar46._0_16_;
      auVar20 = auVar43._0_16_;
      auVar21 = auVar44._0_16_;
      uVar12 = (ulong)((int)uVar12 + 1);
      pdVar6 = pdVar8;
    } while (uVar12 < (ulong)((long)pdVar8 - (long)pdVar4 >> 3));
  }
  auVar67._8_8_ = 0;
  auVar67._0_8_ = auVar17._0_8_;
  auVar68._8_8_ = 0;
  auVar68._0_8_ = auVar18._0_8_;
  auVar18 = vmulsd_avx512f(auVar68,auVar67);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = auVar19._0_8_;
  auVar17 = vmulsd_avx512f(auVar18,auVar17);
  auVar17 = vmovddup_avx512vl(auVar17);
  auVar18 = vmulpd_avx512vl(auVar17,*(undefined1 (*) [16])
                                     (result->
                                     super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>)
                                     .m_storage.m_data.array);
  auVar19 = vmulpd_avx512vl(auVar17,auVar21);
  auVar20 = vmulpd_avx512vl(auVar17,auVar20);
  auVar21 = vmulpd_avx512vl(auVar17,auVar23);
  *(undefined1 (*) [16])
   (result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.array =
       auVar18;
  auVar18 = vmulpd_avx512vl(auVar17,*(undefined1 (*) [16])
                                     ((result->
                                      super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>
                                      ).m_storage.m_data.array + 2));
  *(undefined1 (*) [16])
   ((result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.array
   + 2) = auVar18;
  auVar18 = vmulpd_avx512vl(auVar17,*(undefined1 (*) [16])
                                     ((result->
                                      super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>
                                      ).m_storage.m_data.array + 4));
  *(undefined1 (*) [16])
   ((result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.array
   + 4) = auVar18;
  auVar18 = vmulpd_avx512vl(auVar17,auVar22);
  *(undefined1 (*) [16])
   ((result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.array
   + 6) = auVar20;
  *(undefined1 (*) [16])
   ((result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.array
   + 8) = auVar19;
  auVar19 = vmulpd_avx512vl(auVar17,auVar24);
  *(undefined1 (*) [16])
   ((result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.array
   + 10) = auVar18;
  *(undefined1 (*) [16])
   ((result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.array
   + 0xc) = auVar21;
  auVar18 = vmulpd_avx512vl(auVar17,auVar25);
  *(undefined1 (*) [16])
   ((result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.array
   + 0xe) = auVar19;
  auVar19 = vmulpd_avx512vl(auVar17,auVar26);
  *(undefined1 (*) [16])
   ((result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.array
   + 0x10) = auVar18;
  auVar18 = vmulpd_avx512vl(auVar17,auVar27);
  *(undefined1 (*) [16])
   ((result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.array
   + 0x12) = auVar19;
  auVar19 = vmulpd_avx512vl(auVar17,auVar28);
  *(undefined1 (*) [16])
   ((result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.array
   + 0x14) = auVar18;
  auVar18 = vmulpd_avx512vl(auVar17,auVar29);
  *(undefined1 (*) [16])
   ((result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.array
   + 0x16) = auVar19;
  auVar19 = vmulpd_avx512vl(auVar17,auVar30);
  *(undefined1 (*) [16])
   ((result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.array
   + 0x18) = auVar18;
  auVar18 = vmulpd_avx512vl(auVar17,auVar31);
  *(undefined1 (*) [16])
   ((result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.array
   + 0x1a) = auVar19;
  auVar19 = vmulpd_avx512vl(auVar17,auVar32);
  *(undefined1 (*) [16])
   ((result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.array
   + 0x1c) = auVar18;
  auVar18 = vmulpd_avx512vl(auVar17,auVar33);
  *(undefined1 (*) [16])
   ((result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.array
   + 0x1e) = auVar19;
  auVar19 = vmulpd_avx512vl(auVar17,auVar34);
  *(undefined1 (*) [16])
   ((result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.array
   + 0x20) = auVar18;
  auVar18 = vmulpd_avx512vl(auVar17,auVar35);
  *(undefined1 (*) [16])
   ((result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.array
   + 0x22) = auVar19;
  auVar19 = vmulpd_avx512vl(auVar17,auVar36);
  *(undefined1 (*) [16])
   ((result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.array
   + 0x24) = auVar18;
  auVar18 = vmulpd_avx512vl(auVar17,auVar37);
  *(undefined1 (*) [16])
   ((result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.array
   + 0x26) = auVar19;
  auVar19 = vmulpd_avx512vl(auVar17,auVar38);
  *(undefined1 (*) [16])
   ((result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.array
   + 0x28) = auVar18;
  auVar18 = vmulpd_avx512vl(auVar17,auVar39);
  *(undefined1 (*) [16])
   ((result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.array
   + 0x2a) = auVar19;
  auVar19 = vmulpd_avx512vl(auVar17,auVar40);
  *(undefined1 (*) [16])
   ((result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.array
   + 0x2c) = auVar18;
  auVar18 = vmulpd_avx512vl(auVar17,auVar41);
  *(undefined1 (*) [16])
   ((result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.array
   + 0x2e) = auVar19;
  auVar19 = vmulpd_avx512vl(auVar17,auVar42);
  *(undefined1 (*) [16])
   ((result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.array
   + 0x30) = auVar18;
  auVar16 = vmulpd_avx512vl(auVar17,auVar16);
  *(undefined1 (*) [16])
   ((result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.array
   + 0x32) = auVar19;
  *(undefined1 (*) [16])
   ((result->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.array
   + 0x34) = auVar16;
  if (uVar11 < (uint)order) {
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::~vector(&local_240->Lroots);
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::~vector(&local_240->Weight);
    operator_delete(local_240,0x30);
  }
  return;
}

Assistant:

static void Integrate3D(T& result,                     ///< result is returned here
                            ChIntegrable3D<T>& integrand,  ///< this is the integrand
                            const double Xa,               ///< min limit for x domain
                            const double Xb,               ///< min limit for x domain
                            const double Ya,               ///< min limit for y domain
                            const double Yb,               ///< min limit for y domain
                            const double Za,               ///< min limit for z domain
                            const double Zb,               ///< min limit for z domain
                            const int order)               ///< order of integration
    {
        ChQuadratureTables* mtables = 0;
        std::vector<double>* lroots;
        std::vector<double>* weight;
        bool static_tables;

        if ((unsigned int)order <= GetStaticTables()->Lroots.size()) {
            mtables = GetStaticTables();
            lroots = &mtables->Lroots[order - 1];
            weight = &mtables->Weight[order - 1];
            static_tables = true;
        } else {
            mtables = new ChQuadratureTables(order, order);
            mtables->PrintTables();
            lroots = &mtables->Lroots[0];
            weight = &mtables->Weight[0];
            static_tables = false;
        }

        double Xc1 = (Xb - Xa) / 2;
        double Xc2 = (Xb + Xa) / 2;
        double Yc1 = (Yb - Ya) / 2;
        double Yc2 = (Yb + Ya) / 2;
        double Zc1 = (Zb - Za) / 2;
        double Zc2 = (Zb + Za) / 2;

        result *= 0;  // as result = 0, but works also for matrices.
        T val;        // temporary value for loop

        for (unsigned int ix = 0; ix < lroots->size(); ix++)
            for (unsigned int iy = 0; iy < lroots->size(); iy++)
                for (unsigned int iz = 0; iz < lroots->size(); iz++) {
                    integrand.Evaluate(val, (Xc1 * lroots->at(ix) + Xc2), (Yc1 * lroots->at(iy) + Yc2),
                                       (Zc1 * lroots->at(iz) + Zc2));
                    val *= (weight->at(ix) * weight->at(iy) * weight->at(iz));
                    result += val;
                }
        result *= (Xc1 * Yc1 * Zc1);

        if (!static_tables)
            delete mtables;
    }